

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ModportDeclarationSyntax::ModportDeclarationSyntax
          (ModportDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *items,Token semi)

{
  bool bVar1;
  ModportItemSyntax *pMVar2;
  size_t in_RCX;
  SyntaxNode *in_RDX;
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *in_RDI;
  ModportItemSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *rhs;
  undefined1 in_stack_ffffffffffffffc0 [16];
  MemberSyntax *in_stack_ffffffffffffffd0;
  
  rhs = (SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *)&stack0x00000008;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0._12_4_,
             in_stack_ffffffffffffffc0._0_8_);
  in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode = in_RDX;
  in_RDI[1].super_SyntaxListBase.childCount = in_RCX;
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::SeparatedSyntaxList(in_RDI,rhs);
  in_RDI[2].elements._M_ptr = (pointer)(rhs->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[2].elements._M_extent._M_extent_value =
       *(size_t *)&(rhs->super_SyntaxListBase).super_SyntaxNode;
  in_RDI[2].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)in_RDI;
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *)0x754f29);
  SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::end(in_RDI);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>_>
                      ((self_type *)in_RDI,(iterator_base<slang::syntax::ModportItemSyntax_*> *)rhs)
    ;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pMVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>,_false>
                          *)0x754f68);
    (pMVar2->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::iterator_base<slang::syntax::ModportItemSyntax_*>,_false>
                *)in_RDI);
  }
  return;
}

Assistant:

ModportDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<ModportItemSyntax>& items, Token semi) :
        MemberSyntax(SyntaxKind::ModportDeclaration, attributes), keyword(keyword), items(items), semi(semi) {
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }